

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O2

void __thiscall helics::Message::clear(Message *this)

{
  (this->time).internalTimeCode = 0;
  this->flags = 0;
  this->messageID = 0;
  SmallBuffer::resize(&this->data,0);
  (this->dest)._M_string_length = 0;
  *(this->dest)._M_dataplus._M_p = '\0';
  (this->source)._M_string_length = 0;
  *(this->source)._M_dataplus._M_p = '\0';
  (this->original_source)._M_string_length = 0;
  *(this->original_source)._M_dataplus._M_p = '\0';
  (this->original_dest)._M_string_length = 0;
  *(this->original_dest)._M_dataplus._M_p = '\0';
  this->counter = 0;
  return;
}

Assistant:

void clear()
    {
        time = timeZero;
        flags = 0;
        messageID = 0;
        data.resize(0);
        dest.clear();
        source.clear();
        original_source.clear();
        original_dest.clear();
        counter = 0;
    }